

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

void __thiscall re2::DFA::AddToQueue(DFA *this,Workq *q,int id,uint32_t flag)

{
  uint uVar1;
  int *piVar2;
  Prog *pPVar3;
  int *piVar4;
  int *piVar5;
  Inst *pIVar6;
  uint uVar7;
  _Head_base<1UL,_re2::PODArray<int>::Deleter,_false> _Var8;
  int iVar9;
  ulong uVar10;
  LogMessage local_1b0;
  
  piVar2 = (this->stack_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
           super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  *piVar2 = id;
  uVar10 = 1;
LAB_001c29b1:
  uVar10 = (ulong)((int)uVar10 - 1);
  _Var8._M_head_impl.len_ = (Deleter)piVar2[uVar10];
LAB_001c29b8:
  pPVar3 = this->prog_;
LAB_001c29bd:
  if (_Var8._M_head_impl.len_ == 0) goto LAB_001c2b39;
  if (_Var8._M_head_impl.len_ == -1) {
    Workq::mark(q);
    goto LAB_001c2b39;
  }
  piVar4 = ((_Head_base<0UL,_int_*,_false> *)
           ((long)&(q->super_SparseSet).dense_.ptr_._M_t.
                   super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                   super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter> + 8))->_M_head_impl;
  if ((piVar4 == (int *)0x0) ||
     ((uint)*(int *)&(q->super_SparseSet).dense_.ptr_._M_t.
                     super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                     super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                     super__Tuple_impl<1UL,_re2::PODArray<int>::Deleter>.
                     super__Head_base<1UL,_re2::PODArray<int>::Deleter,_false> <=
      (uint)_Var8._M_head_impl.len_)) {
    q->last_was_mark_ = false;
  }
  else {
    piVar5 = ((_Head_base<0UL,_int_*,_false> *)
             ((long)&(q->super_SparseSet).sparse_.ptr_._M_t.
                     super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                     super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter> + 8))->_M_head_impl;
    uVar7 = piVar5[(int)_Var8._M_head_impl.len_];
    uVar1 = (q->super_SparseSet).size_;
    if ((uVar7 < uVar1) && ((Deleter)piVar4[(int)uVar7] == _Var8._M_head_impl.len_))
    goto LAB_001c2b39;
    q->last_was_mark_ = false;
    piVar5[(int)_Var8._M_head_impl.len_] = uVar1;
    ((Deleter *)(piVar4 + (int)uVar1))->len_ = (int)_Var8._M_head_impl.len_;
    (q->super_SparseSet).size_ = (q->super_SparseSet).size_ + 1;
  }
  pIVar6 = ((_Head_base<0UL,_re2::Prog::Inst_*,_false> *)
           ((long)&(pPVar3->inst_).ptr_._M_t.
                   super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                   _M_t.
                   super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
           + 8))->_M_head_impl;
  uVar7 = pIVar6[(int)_Var8._M_head_impl.len_].out_opcode_;
  iVar9 = (int)uVar10;
  switch(uVar7 & 7) {
  case 1:
    _Var8._M_head_impl.len_ = (Deleter)((int)_Var8._M_head_impl.len_ + 1);
    goto LAB_001c29bd;
  case 2:
  case 5:
    goto switchD_001c2a38_caseD_2;
  case 3:
  case 6:
    goto switchD_001c2a38_caseD_3;
  case 4:
    if ((uVar7 & 8) == 0) {
      uVar10 = (ulong)(iVar9 + 1);
      piVar2[iVar9] = (int)_Var8._M_head_impl.len_ + 1;
    }
    if ((pIVar6[(int)_Var8._M_head_impl.len_].field_1.out1_ & ~flag) != 0) break;
    goto LAB_001c2acd;
  default:
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/dfa.cc"
               ,0x36a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0.str_,"unhandled opcode: ",0x12);
    std::ostream::operator<<
              ((ostream *)&local_1b0.str_,pIVar6[(int)_Var8._M_head_impl.len_].out_opcode_ & 7);
    LogMessage::~LogMessage(&local_1b0);
  }
  goto LAB_001c2b39;
switchD_001c2a38_caseD_3:
  if ((uVar7 & 8) == 0) {
    uVar10 = (ulong)(iVar9 + 1);
    piVar2[iVar9] = (int)_Var8._M_head_impl.len_ + 1;
    uVar7 = pIVar6[(int)_Var8._M_head_impl.len_].out_opcode_;
  }
  if (((((uVar7 & 7) == 6) && (0 < q->maxmark_)) &&
      (_Var8._M_head_impl.len_ == (Deleter)pPVar3->start_unanchored_)) &&
     (_Var8._M_head_impl.len_ != (Deleter)pPVar3->start_)) {
    iVar9 = (int)uVar10;
    uVar10 = (ulong)(iVar9 + 1);
    piVar2[iVar9] = -1;
LAB_001c2acd:
    uVar7 = pIVar6[(int)_Var8._M_head_impl.len_].out_opcode_;
  }
  _Var8._M_head_impl.len_ = (Deleter)(uVar7 >> 4);
  goto LAB_001c29b8;
switchD_001c2a38_caseD_2:
  _Var8._M_head_impl.len_ = (Deleter)((int)_Var8._M_head_impl.len_ + ((uVar7 & 8) >> 3 ^ 1));
  if ((uVar7 & 8) == 0) goto LAB_001c29bd;
LAB_001c2b39:
  if ((int)uVar10 < 1) {
    return;
  }
  goto LAB_001c29b1;
}

Assistant:

void DFA::AddToQueue(Workq* q, int id, uint32_t flag) {

  // Use stack_ to hold our stack of instructions yet to process.
  // It was preallocated as follows:
  //   one entry per Capture;
  //   one entry per EmptyWidth; and
  //   one entry per Nop.
  // This reflects the maximum number of stack pushes that each can
  // perform. (Each instruction can be processed at most once.)
  // When using marks, we also added nmark == prog_->size().
  // (Otherwise, nmark == 0.)
  int* stk = stack_.data();
  int nstk = 0;

  stk[nstk++] = id;
  while (nstk > 0) {
    DCHECK_LE(nstk, stack_.size());
    id = stk[--nstk];

  Loop:
    if (id == Mark) {
      q->mark();
      continue;
    }

    if (id == 0)
      continue;

    // If ip is already on the queue, nothing to do.
    // Otherwise add it.  We don't actually keep all the
    // ones that get added, but adding all of them here
    // increases the likelihood of q->contains(id),
    // reducing the amount of duplicated work.
    if (q->contains(id))
      continue;
    q->insert_new(id);

    // Process instruction.
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstByteRange:  // just save these on the queue
      case kInstMatch:
        if (ip->last())
          break;
        id = id+1;
        goto Loop;

      case kInstCapture:    // DFA treats captures as no-ops.
      case kInstNop:
        if (!ip->last())
          stk[nstk++] = id+1;

        // If this instruction is the [00-FF]* loop at the beginning of
        // a leftmost-longest unanchored search, separate with a Mark so
        // that future threads (which will start farther to the right in
        // the input string) are lower priority than current threads.
        if (ip->opcode() == kInstNop && q->maxmark() > 0 &&
            id == prog_->start_unanchored() && id != prog_->start())
          stk[nstk++] = Mark;
        id = ip->out();
        goto Loop;

      case kInstAltMatch:
        DCHECK(!ip->last());
        id = id+1;
        goto Loop;

      case kInstEmptyWidth:
        if (!ip->last())
          stk[nstk++] = id+1;

        // Continue on if we have all the right flag bits.
        if (ip->empty() & ~flag)
          break;
        id = ip->out();
        goto Loop;
    }
  }
}